

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

void __thiscall CP::list<int>::shift_left(list<int> *this)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  
  pnVar1 = this->mHeader;
  pnVar2 = pnVar1->prev;
  pnVar3 = pnVar1->next;
  pnVar2->next = pnVar3;
  pnVar3->prev = pnVar2;
  pnVar1->prev = pnVar3;
  pnVar1->next = pnVar3->next;
  pnVar3->next = pnVar1;
  pnVar1->next->prev = pnVar1;
  return;
}

Assistant:

void CP::list<T>::shift_left() {
    mHeader->prev->next = mHeader->next;
    mHeader->next->prev = mHeader->prev;
    mHeader->prev = mHeader->next;
    mHeader->next = mHeader->next->next;
    mHeader->prev->next = mHeader;
    mHeader->next->prev = mHeader;
}